

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveTessellation.h
# Opt level: O3

pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
* __thiscall
anurbs::CurveTessellation<3L>::compute
          (pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
           *__return_storage_ptr__,CurveTessellation<3L> *this,CurveBaseD *curve,double tolerance)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer ppVar7;
  pointer ppVar8;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  *ppVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double __tmp;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  vector<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  sample_points;
  vector<double,_std::allocator<double>_> parameters;
  vector<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  points;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  locations;
  double t;
  vector<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  local_148;
  undefined1 local_128 [16];
  pointer pdStack_118;
  double local_110;
  void *local_108;
  void *pvStack_100;
  long local_f8;
  value_type local_e8;
  undefined1 local_c8 [16];
  double local_b8;
  double local_a8;
  double dStack_a0;
  pointer local_98;
  double dStack_90;
  double local_88;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  *local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  double dStack_40;
  
  local_78 = __return_storage_ptr__;
  local_70 = tolerance;
  local_b8 = (double)(**(code **)(*(long *)this + 0x18))(this);
  local_148.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8 = 0;
  local_108 = (void *)0x0;
  pvStack_100 = (void *)0x0;
  (**(code **)(*(long *)this + 0x20))(local_128,this);
  if (local_128._0_8_ != local_128._8_8_) {
    dVar3 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da) - local_b8;
    dVar21 = ABS(dVar3);
    dVar3 = ABS(dVar3);
    local_c8._8_4_ = SUB84(dVar3,0);
    local_c8._0_8_ = dVar21;
    local_c8._12_4_ = (int)((ulong)dVar3 >> 0x20);
    local_a8 = local_b8;
    dStack_a0 = local_b8;
    pdVar14 = (double *)local_128._0_8_;
    dVar18 = local_b8;
    dVar19 = local_b8;
    do {
      auVar16._0_8_ = *pdVar14 - dVar18;
      auVar16._8_8_ = pdVar14[1] - dVar19;
      auVar17._8_4_ = SUB84(dVar3,0);
      auVar17._0_8_ = dVar21;
      auVar17._12_4_ = (int)((ulong)dVar3 >> 0x20);
      auVar17 = divpd(auVar16,auVar17);
      if (1e-07 <= ABS(auVar17._8_8_ - (double)auVar17._0_8_)) {
        local_98 = auVar17._0_8_;
        (**(code **)(*(long *)this + 0x28))(*pdVar14,&local_e8,this);
        std::
        vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
        ::emplace_back<double_const&,Eigen::Matrix<double,1,3,1,1,3>const&>
                  ((vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
                    *)&local_148,(double *)&local_98,(Matrix<double,_1,_3,_1,_1,_3> *)&local_e8);
        dVar21 = local_c8._0_8_;
        dVar3 = local_c8._8_8_;
        dVar18 = local_a8;
        dVar19 = dStack_a0;
      }
      pdVar14 = pdVar14 + 2;
    } while (pdVar14 != (double *)local_128._8_8_);
  }
  if ((double *)local_128._0_8_ != (double *)0x0) {
    operator_delete((void *)local_128._0_8_,(long)pdStack_118 - local_128._0_8_);
  }
  local_e8.first = 1.0;
  dVar3 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da) - local_b8;
  (**(code **)(*(long *)this + 0x28))(local_b8 + dVar3,local_128,this);
  std::
  vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
  ::emplace_back<double,Eigen::Matrix<double,1,3,1,1,3>>
            ((vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
              *)&local_148,&local_e8.first,(Matrix<double,_1,_3,_1,_1,_3> *)local_128);
  ppVar8 = local_148.
           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = local_148.
           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_148.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_148.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar10 = (long)local_148.
                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_148.
                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar12 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>*,std::vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<anurbs::CurveTessellation<3l>::compute(anurbs::CurveBase<3l>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_148.
               super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_148.
               super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>*,std::vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<anurbs::CurveTessellation<3l>::compute(anurbs::CurveBase<3l>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (ppVar7,ppVar8);
  }
  lVar11 = (**(code **)(*(long *)this + 0x10))(this);
  local_68 = (double)(lVar11 * 2 + 2);
  lVar12 = lVar11 * 2 + 1;
  lVar13 = 1;
  if (1 < lVar12) {
    lVar13 = lVar12;
  }
  while( true ) {
    local_128._0_8_ =
         local_148.
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].first;
    local_110 = local_148.
                super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
                [2];
    local_128._8_8_ =
         local_148.
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].second.
         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0];
    pdStack_118 = (pointer)local_148.
                           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                           m_data.array[1];
    local_e8.first = (double)local_128._0_8_ * dVar3 + local_b8;
    local_148.
    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_148.
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::
    vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
    ::emplace_back<double,Eigen::Matrix<double,1,3,1,1,3>const&>
              ((vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
                *)&local_108,&local_e8.first,(Matrix<double,_1,_3,_1,_1,_3> *)(local_128 + 8));
    if (local_148.
        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_148.
        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    while( true ) {
      local_60 = local_148.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first;
      local_48 = local_148.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
                 [0];
      dStack_40 = local_148.
                  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                  super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                  array[1];
      local_58 = local_148.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
                 [2];
      uStack_50 = 0;
      local_e8.first = 0.0;
      if (lVar11 < 0) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_c8._8_8_;
        local_c8 = auVar6 << 0x40;
      }
      else {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_c8._8_8_;
        local_c8 = auVar5 << 0x40;
        lVar12 = 1;
        do {
          local_a8 = (local_60 - (double)local_128._0_8_) * ((double)lVar12 / local_68) +
                     (double)local_128._0_8_;
          (**(code **)(*(long *)this + 0x28))(dVar3 * local_a8 + local_b8,&local_98,this);
          dVar21 = local_48 - (double)local_128._8_8_;
          dVar18 = dStack_40 - (double)pdStack_118;
          dVar19 = local_58 - local_110;
          dVar22 = ((double)pdStack_118 - dStack_90) * dVar19 - dVar18 * (local_110 - local_88);
          dVar23 = dVar21 * (local_110 - local_88) -
                   dVar19 * ((double)local_128._8_8_ - (double)local_98);
          dVar20 = dVar18 * ((double)local_128._8_8_ - (double)local_98) -
                   ((double)pdStack_118 - dStack_90) * dVar21;
          dVar21 = SQRT(dVar20 * dVar20 + dVar23 * dVar23 + dVar22 * dVar22) /
                   SQRT(dVar19 * dVar19 + dVar18 * dVar18 + dVar21 * dVar21);
          if ((double)local_c8._0_8_ < dVar21) {
            local_e8.first = local_a8;
            local_e8.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[0] = (double)local_98;
            local_e8.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[1] = dStack_90;
            local_e8.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[2] = local_88;
            local_c8._0_8_ = dVar21;
          }
          bVar15 = lVar12 != lVar13;
          lVar12 = lVar12 + 1;
        } while (bVar15);
      }
      if ((double)local_c8._0_8_ < local_70) break;
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
      ::push_back(&local_148,&local_e8);
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_128,
             (long)pvStack_100 - (long)local_108 >> 5,(allocator_type *)&local_e8);
  std::
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
            *)&local_e8,(long)pvStack_100 - (long)local_108 >> 5,(allocator_type *)&local_98);
  ppVar9 = local_78;
  if (pvStack_100 != local_108 && -1 < (long)pvStack_100 - (long)local_108) {
    lVar12 = 4;
    lVar13 = 0;
    lVar11 = 0;
    do {
      *(double *)(local_128._0_8_ + lVar11 * 8) = *(double *)((long)local_108 + lVar13);
      puVar1 = (undefined8 *)((long)local_108 + lVar13 + 8);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)local_e8.first + lVar12 * 4 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      *(undefined8 *)((long)local_e8.first + lVar12 * 4) =
           *(undefined8 *)((long)local_108 + lVar13 + 0x18);
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + 0x20;
      lVar12 = lVar12 + 6;
    } while (lVar11 < (long)pvStack_100 - (long)local_108 >> 5);
  }
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ::
  pair<std::vector<double,_std::allocator<double>_>_&,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_&,_true>
            (local_78,(vector<double,_std::allocator<double>_> *)local_128,
             (vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)&local_e8);
  if ((void *)local_e8.first != (void *)0x0) {
    operator_delete((void *)local_e8.first,
                    (long)local_e8.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array[1] - (long)local_e8.first);
  }
  if ((pointer)local_128._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_128._0_8_,(long)pdStack_118 - local_128._0_8_);
  }
  if (local_108 != (void *)0x0) {
    operator_delete(local_108,local_f8 - (long)local_108);
  }
  if (local_148.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return ppVar9;
}

Assistant:

static std::pair<std::vector<double>, std::vector<Vector>> compute(const CurveBaseD& curve, const double tolerance)
    {
        const Interval domain = curve.domain();

        std::vector<ParameterPoint> sample_points;
        std::vector<ParameterPoint> points;

        // compute sample points

        for (const auto& span : curve.spans()) {
            const Interval normalized_span = domain.normalized_interval(span);

            if (normalized_span.length() < 1e-7) {
                continue;
            }

            const double t = normalized_span.t0();
            const Vector point = curve.point_at(span.t0());

            sample_points.emplace_back(t, point);
        }

        sample_points.emplace_back(1.0, curve.point_at(domain.parameter_at_normalized(1.0)));

        std::sort(std::begin(sample_points), std::end(sample_points),
            [](auto const& lhs, auto const& rhs) {
                return std::get<0>(lhs) > std::get<0>(rhs);
            });

        // compute polyline

        const Index n = curve.degree() * 2 + 1;

        while (true) {
            const auto [t_a, point_a] = sample_points.back();
            sample_points.pop_back();

            points.emplace_back(domain.parameter_at_normalized(t_a), point_a);

            if (sample_points.empty()) {
                break;
            }

            while (true) {
                const auto [t_b, point_b] = sample_points.back();

                double max_distance {0};
                ParameterPoint max_point;

                for (Index i = 1; i <= n; i++) {
                    const double t = Interval::parameter_at_normalized(t_a, t_b, i / double(n + 1));
                    const Vector point = curve.point_at(domain.parameter_at_normalized(t));

                    const double distance = distance_to_line(point, point_a, point_b);

                    if (distance > max_distance) {
                        max_distance = distance;
                        max_point = {t, point};
                    }
                }

                if (max_distance < tolerance) {
                    break;
                }

                sample_points.push_back(max_point);
            }
        }

        std::vector<double> parameters(points.size());
        std::vector<Vector> locations(points.size());

        for (Index i = 0; i < length(points); i++) {
            parameters[i] = std::get<0>(points[i]);
            locations[i] = std::get<1>(points[i]);
        }

        return {parameters, locations};
    }